

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

shared_ptr<kratos::AssignStmt> __thiscall kratos::Var::assign(Var *this,Var *var)

{
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<kratos::AssignStmt> sVar2;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            (local_30,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(in_RDX + 0x68));
  (*(var->super_IRNode)._vptr_IRNode[0x2a])(this,var,local_30,2);
  _Var1._M_pi = extraout_RDX;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Var::assign(Var &var) {
    return assign(var.shared_from_this(), AssignmentType::Undefined);
}